

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O1

Output * __thiscall Clasp::Cli::ClaspAppBase::createOutput(ClaspAppBase *this,ProblemType f)

{
  byte bVar1;
  uint32 uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  ulong uVar7;
  Output *this_00;
  TextOptions options;
  
  uVar2 = (this->claspAppOpts_).outf;
  if (uVar2 == 3) {
    this_00 = (Output *)0x0;
  }
  else {
    if ((uVar2 == 2) && ((this->claspAppOpts_).onlyPre == '\0')) {
      uVar4 = Potassco::Application::verbose(&this->super_Application);
      iVar5 = (*(this->super_Application)._vptr_Application[0x1a])(this,(ulong)uVar4);
      uVar7 = CONCAT44(extraout_var,iVar5);
    }
    else {
      Potassco::Application::verbose(&this->super_Application);
      iVar5 = (*(this->super_Application)._vptr_Application[0x19])(this);
      uVar7 = CONCAT44(extraout_var_00,iVar5);
      if ((uVar7 & 0xfffffffffffffffe) == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = __dynamic_cast(uVar7 & 0xfffffffffffffffe,&Output::typeinfo,&TextOutput::typeinfo,0)
        ;
      }
      if (((f == Sat) && ((char)(this->claspConfig_).super_ClaspConfig.parse.set < '\0')) &&
         (lVar6 != 0)) {
        *(char **)(lVar6 + 0x40) = "UNKNOWN";
      }
    }
    this_00 = (Output *)(uVar7 & 0xfffffffffffffffe);
    if (this_00 != (Output *)0x0) {
      bVar1 = (this->claspAppOpts_).quiet[0];
      if (bVar1 != 0xff) {
        bVar3 = 2;
        if (bVar1 < 2) {
          bVar3 = bVar1;
        }
        Output::setModelQuiet(this_00,(uint)bVar3);
      }
      bVar1 = (this->claspAppOpts_).quiet[1];
      if (bVar1 != 0xff) {
        bVar3 = 2;
        if (bVar1 < 2) {
          bVar3 = bVar1;
        }
        Output::setOptQuiet(this_00,(uint)bVar3);
      }
      bVar1 = (this->claspAppOpts_).quiet[2];
      if (bVar1 != 0xff) {
        bVar3 = 2;
        if (bVar1 < 2) {
          bVar3 = bVar1;
        }
        Output::setCallQuiet(this_00,(uint)bVar3);
      }
    }
    if (((this->claspAppOpts_).hideAux == true) &&
       (uVar7 = (this->clasp_).ptr_ & 0xfffffffffffffffe, uVar7 != 0)) {
      OutputTable::setFilter((OutputTable *)(uVar7 + 0x20),'_');
    }
  }
  return this_00;
}

Assistant:

Output* ClaspAppBase::createOutput(ProblemType f) {
	SingleOwnerPtr<Output> out;
	if (claspAppOpts_.outf == ClaspAppOptions::out_none) {
		return 0;
	}
	if (claspAppOpts_.outf != ClaspAppOptions::out_json || claspAppOpts_.onlyPre) {
		TextOptions options;
		options.format = TextOutput::format_asp;
		if      (f == Problem_t::Sat){ options.format = TextOutput::format_sat09; }
		else if (f == Problem_t::Pb) { options.format = TextOutput::format_pb09;  }
		else if (f == Problem_t::Asp && claspAppOpts_.outf == ClaspAppOptions::out_comp) {
			options.format = TextOutput::format_aspcomp;
		}
		options.verbosity = verbose();
		options.catAtom = claspAppOpts_.outAtom.c_str();
		options.ifs = claspAppOpts_.ifs;
		out.reset(createTextOutput(options));
		TextOutput* textOut = dynamic_cast<TextOutput*>(out.get());
		if (claspConfig_.parse.isEnabled(ParserOptions::parse_maxsat) && f == Problem_t::Sat && textOut) {
			textOut->result[TextOutput::res_sat] = "UNKNOWN";
		}
	}
	else {
		out.reset(createJsonOutput(verbose()));
	}

	if (out.get()) {
		if (claspAppOpts_.quiet[0] != static_cast<uint8>(UCHAR_MAX)) {
			out->setModelQuiet((Output::PrintLevel)std::min(uint8(Output::print_no), claspAppOpts_.quiet[0]));
		}
		if (claspAppOpts_.quiet[1] != static_cast<uint8>(UCHAR_MAX)) {
			out->setOptQuiet((Output::PrintLevel)std::min(uint8(Output::print_no), claspAppOpts_.quiet[1]));
		}
		if (claspAppOpts_.quiet[2] != static_cast<uint8>(UCHAR_MAX)) {
			out->setCallQuiet((Output::PrintLevel)std::min(uint8(Output::print_no), claspAppOpts_.quiet[2]));
		}
	}
	if (claspAppOpts_.hideAux && clasp_.get()) {
		clasp_->ctx.output.setFilter('_');
	}
	return out.release();
}